

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall
Lowerer::GenerateCallProfiling
          (Lowerer *this,ProfileId profileId,InlineCacheIndex inlineCacheIndex,Opnd *retval,
          Opnd *calleeFunctionObjOpnd,Opnd *callInfo,bool returnTypeOnly,Instr *callInstr,
          Instr *insertAfter)

{
  Func *func;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Opnd *opnd;
  RegOpnd *pRVar4;
  Instr *pIVar5;
  HelperCallOpnd *newSrc;
  IntConstOpnd *pIVar6;
  JnHelperMethod fnHelper;
  LowererMD *this_00;
  undefined1 local_88 [8];
  AutoReuseOpnd a;
  AutoReuseOpnd b;
  
  bVar2 = Func::DoSimpleJitDynamicProfile(this->m_func);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1290,"(m_func->DoSimpleJitDynamicProfile())",
                       "m_func->DoSimpleJitDynamicProfile()");
    if (!bVar2) goto LAB_00565f2e;
    *puVar3 = 0;
  }
  if (callInstr->m_opcode != CALL) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1294,"(callInstr->m_opcode == Js::OpCode::CALL)",
                       "callInstr->m_opcode == Js::OpCode::CALL");
    if (!bVar2) {
LAB_00565f2e:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  func = insertAfter->m_func;
  opnd = GetImplicitCallFlagsOpnd(this);
  pRVar4 = IR::RegOpnd::New(opnd->m_type,func);
  IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)local_88,opnd,func,true);
  IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)&a.autoDelete,&pRVar4->super_Opnd,func,true);
  InsertMove(&pRVar4->super_Opnd,opnd,callInstr,true);
  InsertMove(opnd,&pRVar4->super_Opnd,insertAfter->m_next,true);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&a.autoDelete);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_88);
  if (retval == (Opnd *)0x0) {
    if (returnTypeOnly) {
      return insertAfter;
    }
    retval = &IR::AddrOpnd::NewNull(func)->super_Opnd;
  }
  pIVar5 = IR::Instr::New(Call,func);
  fnHelper = HelperSimpleProfileReturnTypeCall;
  if (!returnTypeOnly) {
    fnHelper = inlineCacheIndex == 0xffffffff ^ HelperSimpleProfileCall;
  }
  newSrc = IR::HelperCallOpnd::New(fnHelper,func);
  IR::Instr::SetSrc1(pIVar5,&newSrc->super_Opnd);
  IR::Instr::InsertAfter(insertAfter,pIVar5);
  this_00 = &this->m_lowererMD;
  LowererMD::LoadHelperArgument(this_00,pIVar5,callInfo);
  LowererMD::LoadHelperArgument(this_00,pIVar5,calleeFunctionObjOpnd);
  LowererMD::LoadHelperArgument(this_00,pIVar5,retval);
  if (inlineCacheIndex != 0xffffffff && !returnTypeOnly) {
    pIVar6 = IR::Opnd::CreateInlineCacheIndexOpnd(inlineCacheIndex,func);
    LowererMD::LoadHelperArgument(this_00,pIVar5,&pIVar6->super_Opnd);
  }
  pIVar6 = IR::Opnd::CreateProfileIdOpnd(profileId,func);
  LowererMD::LoadHelperArgument(this_00,pIVar5,&pIVar6->super_Opnd);
  pRVar4 = IR::Opnd::CreateFramePointerOpnd(func);
  LowererMD::LoadHelperArgument(this_00,pIVar5,&pRVar4->super_Opnd);
  pIVar5 = LowererMD::LowerCall(this_00,pIVar5,0);
  return pIVar5;
}

Assistant:

IR::Instr*
Lowerer::GenerateCallProfiling(Js::ProfileId profileId, Js::InlineCacheIndex inlineCacheIndex, IR::Opnd* retval, IR::Opnd*calleeFunctionObjOpnd, IR::Opnd* callInfo, bool returnTypeOnly, IR::Instr*callInstr,IR::Instr*insertAfter)
{
    // This should only ever happen in profiling simplejit
    Assert(m_func->DoSimpleJitDynamicProfile());

    // Make sure they gave us the correct call instruction
#if defined(_M_IX86) || defined(_M_X64)
    Assert(callInstr->m_opcode == Js::OpCode::CALL);
#elif defined(_M_ARM)
    Assert(callInstr->m_opcode == Js::OpCode::BLX);
#elif defined(_M_ARM64)
    Assert(callInstr->m_opcode == Js::OpCode::BLR);
#endif
    Func*const func = insertAfter->m_func;

    {
        // First, we should save the implicit call flags
        const auto starFlag = GetImplicitCallFlagsOpnd();
        const auto saveOpnd = IR::RegOpnd::New(starFlag->GetType(), func);

        IR::AutoReuseOpnd a(starFlag, func), b(saveOpnd, func);
        //Save the flags (before call) and restore them (after the call)
        this->InsertMove(saveOpnd, starFlag, callInstr);
        // Note: On arm this is slightly inefficient because it forces a reload of the memory location to a reg (whereas x86 can load straight from hard-coded memory into a reg)
        //    But it works and making it not reload the memory location would force more refactoring.
        this->InsertMove(starFlag, saveOpnd, insertAfter->m_next);
    }

    // Profile a call that just happened: push some extra info on the stack and call the helper

    if (!retval)
    {
        if (returnTypeOnly)
        {
            // If we are only supposed to profile the return type but don't use the return value, we might
            // as well do nothing!
            return insertAfter;
        }
        retval = IR::AddrOpnd::NewNull(func);
    }

    IR::Instr* profileCall = IR::Instr::New(Js::OpCode::Call, func);

    bool needInlineCacheIndex;
    IR::JnHelperMethod helperMethod;
    if (returnTypeOnly)
    {
        needInlineCacheIndex = false;
        helperMethod = IR::HelperSimpleProfileReturnTypeCall;
    }
    else if(inlineCacheIndex == Js::Constants::NoInlineCacheIndex)
    {
        needInlineCacheIndex = false;
        helperMethod = IR::HelperSimpleProfileCall_DefaultInlineCacheIndex;
    }
    else
    {
        needInlineCacheIndex = true;
        helperMethod = IR::HelperSimpleProfileCall;
    }
    profileCall->SetSrc1(IR::HelperCallOpnd::New(helperMethod, func));

    insertAfter->InsertAfter(profileCall);

    m_lowererMD.LoadHelperArgument(profileCall, callInfo);
    m_lowererMD.LoadHelperArgument(profileCall, calleeFunctionObjOpnd);
    m_lowererMD.LoadHelperArgument(profileCall, retval);
    if(needInlineCacheIndex)
    {
        m_lowererMD.LoadHelperArgument(profileCall, IR::Opnd::CreateInlineCacheIndexOpnd(inlineCacheIndex, func));
    }
    m_lowererMD.LoadHelperArgument(profileCall, IR::Opnd::CreateProfileIdOpnd(profileId, func));
    // Push the frame pointer so that the profiling call can grab the stack layout
    m_lowererMD.LoadHelperArgument(profileCall, IR::Opnd::CreateFramePointerOpnd(func));

    // No args: the helper is stdcall
    return m_lowererMD.LowerCall(profileCall, 0);
}